

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

uint32_t spvtools::opt::anon_unknown_0::NegateFloatingPointConstant
                   (ConstantManager *const_mgr,Constant *c)

{
  int iVar1;
  uint32_t uVar2;
  Type *pTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Constant *c_00;
  Instruction *this;
  float fVar4;
  double dVar5;
  Constant *negated_const;
  FloatProxy<float> local_5c;
  undefined1 local_58 [4];
  FloatProxy<float> result_1;
  FloatProxy<double> local_40;
  FloatProxy<double> result;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  uint32_t width;
  Constant *c_local;
  ConstantManager *const_mgr_local;
  
  if (c == (Constant *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0xd1,
                  "uint32_t spvtools::opt::(anonymous namespace)::NegateFloatingPointConstant(analysis::ConstantManager *, const analysis::Constant *)"
                 );
  }
  pTVar3 = analysis::Constant::type(c);
  iVar1 = (*pTVar3->_vptr_Type[0xc])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    pTVar3 = analysis::Constant::type(c);
    iVar1 = (*pTVar3->_vptr_Type[0xc])();
    uVar2 = analysis::Float::width((Float *)CONCAT44(extraout_var_00,iVar1));
    if (uVar2 != 0x20 && uVar2 != 0x40) {
      __assert_fail("width == 32 || width == 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0xd4,
                    "uint32_t spvtools::opt::(anonymous namespace)::NegateFloatingPointConstant(analysis::ConstantManager *, const analysis::Constant *)"
                   );
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&result);
    if (uVar2 == 0x40) {
      dVar5 = analysis::Constant::GetDouble(c);
      utils::FloatProxy<double>::FloatProxy(&local_40,dVar5 * -1.0);
      utils::FloatProxy<double>::GetWords
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,&local_40);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&result,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
    }
    else {
      fVar4 = analysis::Constant::GetFloat(c);
      utils::FloatProxy<float>::FloatProxy(&local_5c,fVar4 * -1.0);
      utils::FloatProxy<float>::GetWords
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&negated_const,&local_5c);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&result,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&negated_const);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&negated_const);
    }
    pTVar3 = analysis::Constant::type(c);
    c_00 = analysis::ConstantManager::GetConstant
                     (const_mgr,pTVar3,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&result);
    this = analysis::ConstantManager::GetDefiningInstruction(const_mgr,c_00,0,(inst_iterator *)0x0);
    uVar2 = opt::Instruction::result_id(this);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&result);
    return uVar2;
  }
  __assert_fail("c->type()->AsFloat()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                ,0xd2,
                "uint32_t spvtools::opt::(anonymous namespace)::NegateFloatingPointConstant(analysis::ConstantManager *, const analysis::Constant *)"
               );
}

Assistant:

uint32_t NegateFloatingPointConstant(analysis::ConstantManager* const_mgr,
                                     const analysis::Constant* c) {
  assert(c);
  assert(c->type()->AsFloat());
  uint32_t width = c->type()->AsFloat()->width();
  assert(width == 32 || width == 64);
  std::vector<uint32_t> words;
  if (width == 64) {
    utils::FloatProxy<double> result(c->GetDouble() * -1.0);
    words = result.GetWords();
  } else {
    utils::FloatProxy<float> result(c->GetFloat() * -1.0f);
    words = result.GetWords();
  }

  const analysis::Constant* negated_const =
      const_mgr->GetConstant(c->type(), std::move(words));
  return const_mgr->GetDefiningInstruction(negated_const)->result_id();
}